

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O0

int stb_vorbis_get_samples_float_interleaved
              (stb_vorbis *f,int channels,float *buffer,int num_floats)

{
  int iVar1;
  int iVar2;
  int in_ECX;
  undefined4 *in_RDX;
  int in_ESI;
  long in_RDI;
  int k;
  int j;
  int i;
  int z;
  int n;
  int len;
  float **outputs;
  int local_40;
  int local_3c;
  int in_stack_ffffffffffffffc8;
  int iVar3;
  int iVar4;
  stb_vorbis *in_stack_ffffffffffffffd8;
  undefined4 *local_18;
  
  iVar1 = in_ECX / in_ESI;
  iVar4 = 0;
  iVar3 = *(int *)(in_RDI + 4);
  local_18 = in_RDX;
  if (in_ESI < *(int *)(in_RDI + 4)) {
    iVar3 = in_ESI;
  }
  while( true ) {
    if (iVar1 <= iVar4) {
      return iVar4;
    }
    local_40 = *(int *)(in_RDI + 0x768) - *(int *)(in_RDI + 0x764);
    if (iVar1 <= iVar4 + local_40) {
      local_40 = iVar1 - iVar4;
    }
    for (local_3c = 0; local_3c < local_40; local_3c = local_3c + 1) {
      for (in_stack_ffffffffffffffc8 = 0; in_stack_ffffffffffffffc8 < iVar3;
          in_stack_ffffffffffffffc8 = in_stack_ffffffffffffffc8 + 1) {
        *local_18 = *(undefined4 *)
                     (*(long *)(in_RDI + 0x378 + (long)in_stack_ffffffffffffffc8 * 8) +
                     (long)(*(int *)(in_RDI + 0x764) + local_3c) * 4);
        local_18 = local_18 + 1;
      }
      for (; in_stack_ffffffffffffffc8 < in_ESI;
          in_stack_ffffffffffffffc8 = in_stack_ffffffffffffffc8 + 1) {
        *local_18 = 0;
        local_18 = local_18 + 1;
      }
    }
    iVar4 = local_40 + iVar4;
    *(int *)(in_RDI + 0x764) = local_40 + *(int *)(in_RDI + 0x764);
    if (iVar4 == iVar1) break;
    iVar2 = stb_vorbis_get_frame_float
                      (in_stack_ffffffffffffffd8,(int *)CONCAT44(iVar1,iVar4),
                       (float ***)CONCAT44(iVar3,in_stack_ffffffffffffffc8));
    if (iVar2 == 0) {
      return iVar4;
    }
  }
  return iVar4;
}

Assistant:

int stb_vorbis_get_samples_float_interleaved(stb_vorbis *f, int channels, float *buffer, int num_floats)
{
   float **outputs;
   int len = num_floats / channels;
   int n=0;
   int z = f->channels;
   if (z > channels) z = channels;
   while (n < len) {
      int i,j;
      int k = f->channel_buffer_end - f->channel_buffer_start;
      if (n+k >= len) k = len - n;
      for (j=0; j < k; ++j) {
         for (i=0; i < z; ++i)
            *buffer++ = f->channel_buffers[i][f->channel_buffer_start+j];
         for (   ; i < channels; ++i)
            *buffer++ = 0;
      }
      n += k;
      f->channel_buffer_start += k;
      if (n == len)
         break;
      if (!stb_vorbis_get_frame_float(f, NULL, &outputs))
         break;
   }
   return n;
}